

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

double time_oo<trng::lagfib2plus<unsigned_long,9842u,19937u>>
                 (lagfib2plus<unsigned_long,_9842U,_19937U> *r)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  string res;
  string local_38;
  double local_18;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  uVar5 = (ulong)(r->S).index;
  dVar7 = 0.0;
  lVar3 = 0x1000000;
  do {
    iVar1 = (int)uVar5;
    uVar4 = iVar1 + 1U & 0x7fff;
    uVar5 = (ulong)uVar4;
    uVar6 = (r->S).r[iVar1 + 0x3220U & 0x7fff] + (r->S).r[iVar1 + 0x598fU & 0x7fff];
    (r->S).r[uVar5] = uVar6;
    dVar7 = dVar7 + (double)(uVar6 >> 1) * 1.084202172485504e-19 + 2.220446049250313e-16;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  (r->S).index = uVar4;
  lVar3 = std::chrono::_V2::system_clock::now();
  local_18 = 16.777216 / ((double)((lVar3 - lVar2) / 1000) * 1e-06);
  to_string<double>(&local_38,&local_18);
  while (local_38._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return dVar7;
}

Assistant:

double time_oo(R &r) {
  double s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += trng::utility::uniformoo<double>(r);
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}